

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

iterator anon_unknown.dwarf_44c526::TransformConfigure
                   (TransformAction action,
                   unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
                   *selector,size_t arity)

{
  _Link_type p_Var1;
  TransformSelector *pTVar2;
  undefined8 uVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr *pp_Var7;
  TransformSelector *this;
  transform_error *ptVar8;
  _Link_type p_Var9;
  _Link_type p_Var10;
  char *pcVar11;
  _Base_ptr p_Var12;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar13;
  undefined1 local_90 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_78;
  size_t local_68;
  _Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false> _Stack_60;
  TransformAction local_54;
  string local_50;
  
  if ((anonymous_namespace)::Descriptors._64_8_ == 0) {
    p_Var5 = (_Base_ptr)operator_new(0x30);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    p_Var5->_M_left = (_Base_ptr)0x0;
    p_Var5->_M_right = (_Base_ptr)0x0;
    *(undefined8 *)(p_Var5 + 1) = 0;
    p_Var5[1]._M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformActionAppend_0098c7d0;
    p_Var5->_M_left = p_Var5 + 1;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    p_Var10 = (_Link_type)0x712bcc;
    local_54 = action;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"APPEND",(allocator<char> *)&local_50);
    uVar3 = local_90._8_8_;
    p_Var6[1]._M_color = _S_red;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    p_Var1 = (_Link_type)(local_90 + 0x10);
    if ((_Link_type)local_90._0_8_ == p_Var1) {
      p_Var6[1]._M_right = (_Base_ptr)local_90._16_8_;
      *(ulong *)(p_Var6 + 2) =
           CONCAT71(aStack_78._M_allocated_capacity._1_7_,aStack_78._M_local_buf[0]);
    }
    else {
      p_Var6[1]._M_parent = (_Base_ptr)local_90._0_8_;
      p_Var6[1]._M_right = (_Base_ptr)local_90._16_8_;
    }
    local_90._8_8_ = (_Base_ptr)0x0;
    p_Var6[1]._M_left = (_Base_ptr)uVar3;
    local_90._16_8_ = local_90._16_8_ & 0xffffffffffffff00;
    p_Var6[2]._M_parent = (_Base_ptr)0x1;
    p_Var6[2]._M_left = p_Var5;
    p_Var9 = (_Link_type)local_90._0_8_;
    local_90._0_8_ = p_Var1;
    std::__cxx11::string::~string((string *)local_90);
    pVar13 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)p_Var10);
    if (pVar13.second == (_Base_ptr)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,p_Var10);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar13.first,pVar13.second,p_Var6,p_Var9);
    }
    p_Var5 = (_Base_ptr)operator_new(0x30);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    p_Var5->_M_left = (_Base_ptr)0x0;
    p_Var5->_M_right = (_Base_ptr)0x0;
    *(undefined8 *)(p_Var5 + 1) = 0;
    p_Var5[1]._M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformActionPrepend_0098c838;
    p_Var5->_M_left = p_Var5 + 1;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    pcVar11 = "PREPEND";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"PREPEND",(allocator<char> *)&local_50);
    uVar3 = local_90._8_8_;
    p_Var6[1]._M_color = _S_black;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    if ((_Link_type)local_90._0_8_ == p_Var1) {
      p_Var6[1]._M_right = (_Base_ptr)local_90._16_8_;
      *(ulong *)(p_Var6 + 2) =
           CONCAT71(aStack_78._M_allocated_capacity._1_7_,aStack_78._M_local_buf[0]);
    }
    else {
      p_Var6[1]._M_parent = (_Base_ptr)local_90._0_8_;
      p_Var6[1]._M_right = (_Base_ptr)local_90._16_8_;
    }
    local_90._8_8_ = (_Base_ptr)0x0;
    p_Var6[1]._M_left = (_Base_ptr)uVar3;
    local_90._16_8_ = local_90._16_8_ & 0xffffffffffffff00;
    p_Var6[2]._M_parent = (_Base_ptr)0x1;
    p_Var6[2]._M_left = p_Var5;
    p_Var10 = (_Link_type)local_90._0_8_;
    local_90._0_8_ = p_Var1;
    std::__cxx11::string::~string((string *)local_90);
    pVar13 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)pcVar11);
    if (pVar13.second == (_Base_ptr)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,(_Link_type)pcVar11);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar13.first,pVar13.second,p_Var6,p_Var10);
    }
    p_Var5 = (_Base_ptr)operator_new(0x10);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformAction_0098c890;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    pcVar11 = "TOUPPER";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"TOUPPER",(allocator<char> *)&local_50);
    p_Var6[1]._M_color = 3;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    if ((_Link_type)local_90._0_8_ == p_Var1) {
      p_Var6[1]._M_right = (_Base_ptr)local_90._16_8_;
      *(ulong *)(p_Var6 + 2) =
           CONCAT71(aStack_78._M_allocated_capacity._1_7_,aStack_78._M_local_buf[0]);
    }
    else {
      p_Var6[1]._M_parent = (_Base_ptr)local_90._0_8_;
      p_Var6[1]._M_right = (_Base_ptr)local_90._16_8_;
    }
    p_Var6[1]._M_left = (_Base_ptr)local_90._8_8_;
    local_90._8_8_ = (_Base_ptr)0x0;
    local_90._16_8_ = local_90._16_8_ & 0xffffffffffffff00;
    p_Var6[2]._M_parent = (_Base_ptr)0x0;
    p_Var6[2]._M_left = p_Var5;
    p_Var10 = (_Link_type)local_90._0_8_;
    local_90._0_8_ = p_Var1;
    std::__cxx11::string::~string((string *)local_90);
    pVar13 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)pcVar11);
    if (pVar13.second == (_Base_ptr)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,(_Link_type)pcVar11);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar13.first,pVar13.second,p_Var6,p_Var10);
    }
    p_Var5 = (_Base_ptr)operator_new(0x10);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformAction_0098c8e8;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    pcVar11 = "TOLOWER";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"TOLOWER",(allocator<char> *)&local_50);
    p_Var6[1]._M_color = 2;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    if ((_Link_type)local_90._0_8_ == p_Var1) {
      p_Var6[1]._M_right = (_Base_ptr)local_90._16_8_;
      *(ulong *)(p_Var6 + 2) =
           CONCAT71(aStack_78._M_allocated_capacity._1_7_,aStack_78._M_local_buf[0]);
    }
    else {
      p_Var6[1]._M_parent = (_Base_ptr)local_90._0_8_;
      p_Var6[1]._M_right = (_Base_ptr)local_90._16_8_;
    }
    p_Var6[1]._M_left = (_Base_ptr)local_90._8_8_;
    local_90._8_8_ = (_Base_ptr)0x0;
    local_90._16_8_ = local_90._16_8_ & 0xffffffffffffff00;
    p_Var6[2]._M_parent = (_Base_ptr)0x0;
    p_Var6[2]._M_left = p_Var5;
    p_Var10 = (_Link_type)local_90._0_8_;
    local_90._0_8_ = p_Var1;
    std::__cxx11::string::~string((string *)local_90);
    pVar13 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)pcVar11);
    if (pVar13.second == (_Base_ptr)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,(_Link_type)pcVar11);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar13.first,pVar13.second,p_Var6,p_Var10);
    }
    p_Var5 = (_Base_ptr)operator_new(0x10);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformAction_0098c940;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    p_Var10 = (_Link_type)0x6c2f47;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"STRIP",(allocator<char> *)&local_50);
    p_Var6[1]._M_color = 4;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    if ((_Link_type)local_90._0_8_ == p_Var1) {
      p_Var6[1]._M_right = (_Base_ptr)local_90._16_8_;
      *(ulong *)(p_Var6 + 2) =
           CONCAT71(aStack_78._M_allocated_capacity._1_7_,aStack_78._M_local_buf[0]);
    }
    else {
      p_Var6[1]._M_parent = (_Base_ptr)local_90._0_8_;
      p_Var6[1]._M_right = (_Base_ptr)local_90._16_8_;
    }
    p_Var6[1]._M_left = (_Base_ptr)local_90._8_8_;
    local_90._8_8_ = (_Base_ptr)0x0;
    local_90._16_8_ = local_90._16_8_ & 0xffffffffffffff00;
    p_Var6[2]._M_parent = (_Base_ptr)0x0;
    p_Var6[2]._M_left = p_Var5;
    p_Var9 = (_Link_type)local_90._0_8_;
    local_90._0_8_ = p_Var1;
    std::__cxx11::string::~string((string *)local_90);
    pVar13 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)p_Var10);
    if (pVar13.second == (_Base_ptr)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,p_Var10);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar13.first,pVar13.second,p_Var6,p_Var9);
    }
    p_Var5 = (_Base_ptr)operator_new(0x10);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformAction_0098c998;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    pcVar11 = "GENEX_STRIP";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"GENEX_STRIP",(allocator<char> *)&local_50);
    p_Var6[1]._M_color = 5;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    if ((_Link_type)local_90._0_8_ == p_Var1) {
      p_Var6[1]._M_right = (_Base_ptr)local_90._16_8_;
      *(ulong *)(p_Var6 + 2) =
           CONCAT71(aStack_78._M_allocated_capacity._1_7_,aStack_78._M_local_buf[0]);
    }
    else {
      p_Var6[1]._M_parent = (_Base_ptr)local_90._0_8_;
      p_Var6[1]._M_right = (_Base_ptr)local_90._16_8_;
    }
    p_Var6[1]._M_left = (_Base_ptr)local_90._8_8_;
    local_90._8_8_ = (_Base_ptr)0x0;
    local_90._16_8_ = local_90._16_8_ & 0xffffffffffffff00;
    p_Var6[2]._M_parent = (_Base_ptr)0x0;
    p_Var6[2]._M_left = p_Var5;
    p_Var10 = (_Link_type)local_90._0_8_;
    local_90._0_8_ = p_Var1;
    std::__cxx11::string::~string((string *)local_90);
    pVar13 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)pcVar11);
    if (pVar13.second == (_Base_ptr)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,(_Link_type)pcVar11);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar13.first,pVar13.second,p_Var6,p_Var10);
    }
    p_Var5 = (_Base_ptr)operator_new(0x18);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformActionReplace_0098c9f0;
    p_Var5->_M_left = (_Base_ptr)0x0;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    p_Var10 = (_Link_type)0x6f3451;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"REPLACE",(allocator<char> *)&local_50);
    uVar3 = local_90._8_8_;
    p_Var6[1]._M_color = 6;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    if ((_Link_type)local_90._0_8_ == p_Var1) {
      p_Var6[1]._M_right = (_Base_ptr)local_90._16_8_;
      *(ulong *)(p_Var6 + 2) =
           CONCAT71(aStack_78._M_allocated_capacity._1_7_,aStack_78._M_local_buf[0]);
    }
    else {
      p_Var6[1]._M_parent = (_Base_ptr)local_90._0_8_;
      p_Var6[1]._M_right = (_Base_ptr)local_90._16_8_;
    }
    local_90._8_8_ = (pointer)0x0;
    p_Var6[1]._M_left = (_Base_ptr)uVar3;
    local_90._16_8_ = local_90._16_8_ & 0xffffffffffffff00;
    p_Var6[2]._M_parent = (_Base_ptr)0x2;
    p_Var6[2]._M_left = p_Var5;
    p_Var9 = (_Link_type)local_90._0_8_;
    local_90._0_8_ = p_Var1;
    std::__cxx11::string::~string((string *)local_90);
    pVar13 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)p_Var10);
    action = local_54;
    if (pVar13.second == (_Base_ptr)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,p_Var10);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar13.first,pVar13.second,p_Var6,p_Var9);
    }
  }
  local_90._8_8_ = &aStack_78;
  local_90._0_4_ = action;
  local_90._16_8_ = 0;
  aStack_78._M_local_buf[0] = '\0';
  local_68 = 0;
  _Stack_60._M_head_impl = (TransformAction *)0x0;
  pp_Var7 = (_Base_ptr *)((anonymous_namespace)::Descriptors + 0x28);
  p_Var6 = (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20);
  while( true ) {
    p_Var12 = *pp_Var7;
    if (p_Var12 == (_Base_ptr)0x0) break;
    bVar4 = std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>::operator()
                      ((function<bool_(cmList::TransformAction,_cmList::TransformAction)> *)
                       (anonymous_namespace)::Descriptors,p_Var12[1]._M_color,local_90._0_4_);
    if (!bVar4) {
      p_Var6 = p_Var12;
    }
    pp_Var7 = &p_Var12->_M_left + bVar4;
  }
  p_Var12 = (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20);
  if ((p_Var6 != (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20)) &&
     (bVar4 = std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>::operator()
                        ((function<bool_(cmList::TransformAction,_cmList::TransformAction)> *)
                         (anonymous_namespace)::Descriptors,local_90._0_4_,p_Var6[1]._M_color),
     p_Var12 = p_Var6, bVar4)) {
    p_Var12 = (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20);
  }
  ActionDescriptor::~ActionDescriptor((ActionDescriptor *)local_90);
  if (p_Var12 == (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20)) {
    ptVar8 = (transform_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_50,action);
    cmStrCat<char_const(&)[25],std::__cxx11::string,char_const(&)[17]>
              ((string *)local_90,(char (*) [25])" sub-command TRANSFORM, ",&local_50,
               (char (*) [17])" invalid action.");
    cmList::transform_error::transform_error(ptVar8,(string *)local_90);
    __cxa_throw(ptVar8,&cmList::transform_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (p_Var12[2]._M_parent != (_Base_ptr)arity) {
    ptVar8 = (transform_error *)__cxa_allocate_exception(0x10);
    cmStrCat<char_const(&)[31],std::__cxx11::string_const&,char_const(&)[10],unsigned_long_const&,char_const(&)[14]>
              ((string *)local_90,(char (*) [31])"sub-command TRANSFORM, action ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &p_Var12[1]._M_parent,(char (*) [10])" expects ",
               (unsigned_long *)&p_Var12[2]._M_parent,(char (*) [14])0x6eb66a);
    cmList::transform_error::transform_error(ptVar8,(string *)local_90);
    __cxa_throw(ptVar8,&cmList::transform_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((selector->_M_t).
      super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
      .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl ==
      (TransformSelector *)0x0) {
    this = (TransformSelector *)operator_new(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,"NO SELECTOR",(allocator<char> *)&local_50);
    TransformSelector::TransformSelector(this,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    (this->super_TransformSelector)._vptr_TransformSelector =
         (_func_int **)&PTR__TransformSelector_0098ca48;
    pTVar2 = (selector->_M_t).
             super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
             .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl;
    (selector->_M_t).
    super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
    .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl =
         (TransformSelector *)this;
    if (pTVar2 != (TransformSelector *)0x0) {
      (*pTVar2->_vptr_TransformSelector[1])();
    }
  }
  return (iterator)p_Var12;
}

Assistant:

ActionDescriptorSet::iterator TransformConfigure(
  cmList::TransformAction action,
  std::unique_ptr<cmList::TransformSelector>& selector, std::size_t arity)
{
  if (Descriptors.empty()) {
    Descriptors.emplace(cmList::TransformAction::APPEND, "APPEND", 1,
                        cm::make_unique<TransformActionAppend>());
    Descriptors.emplace(cmList::TransformAction::PREPEND, "PREPEND", 1,
                        cm::make_unique<TransformActionPrepend>());
    Descriptors.emplace(cmList::TransformAction::TOUPPER, "TOUPPER", 0,
                        cm::make_unique<TransformActionToUpper>());
    Descriptors.emplace(cmList::TransformAction::TOLOWER, "TOLOWER", 0,
                        cm::make_unique<TransformActionToLower>());
    Descriptors.emplace(cmList::TransformAction::STRIP, "STRIP", 0,
                        cm::make_unique<TransformActionStrip>());
    Descriptors.emplace(cmList::TransformAction::GENEX_STRIP, "GENEX_STRIP", 0,
                        cm::make_unique<TransformActionGenexStrip>());
    Descriptors.emplace(cmList::TransformAction::REPLACE, "REPLACE", 2,
                        cm::make_unique<TransformActionReplace>());
  }

  auto descriptor = Descriptors.find(action);
  if (descriptor == Descriptors.end()) {
    throw transform_error(cmStrCat(" sub-command TRANSFORM, ",
                                   std::to_string(static_cast<int>(action)),
                                   " invalid action."));
  }

  if (descriptor->Arity != arity) {
    throw transform_error(cmStrCat("sub-command TRANSFORM, action ",
                                   descriptor->Name, " expects ",
                                   descriptor->Arity, " argument(s)."));
  }
  if (!selector) {
    selector = cm::make_unique<TransformNoSelector>();
  }

  return descriptor;
}